

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.cpp
# Opt level: O0

int luaK_codek(FuncState *fs,int reg,int k)

{
  int p;
  int k_local;
  int reg_local;
  FuncState *fs_local;
  
  if (k < 0x40000) {
    fs_local._4_4_ = luaK_codeABx(fs,OP_LOADK,reg,k);
  }
  else {
    fs_local._4_4_ = luaK_codeABx(fs,OP_LOADKX,reg,0);
    codeextraarg(fs,k);
  }
  return fs_local._4_4_;
}

Assistant:

int luaK_codek (FuncState *fs, int reg, int k) {
  if (k <= MAXARG_Bx)
    return luaK_codeABx(fs, OP_LOADK, reg, k);
  else {
    int p = luaK_codeABx(fs, OP_LOADKX, reg, 0);
    codeextraarg(fs, k);
    return p;
  }
}